

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginTest.cpp
# Opt level: O0

void __thiscall
TEST_PluginTest_ActionsAllRun_Test::testBody(TEST_PluginTest_ActionsAllRun_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_PluginTest_ActionsAllRun_Test *local_10;
  TEST_PluginTest_ActionsAllRun_Test *this_local;
  
  local_10 = this;
  TestTestingFixture::runAllTests((this->super_TEST_GROUP_CppUTestGroupPluginTest).genFixture);
  TestTestingFixture::runAllTests((this->super_TEST_GROUP_CppUTestGroupPluginTest).genFixture);
  if (*(int *)&(((this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin)->super_TestPlugin).
               field_0x24 == 2) {
    pUVar1 = UtestShell::getCurrent();
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar1->_vptr_UtestShell[0xe])
              (pUVar1,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x89,pTVar4);
  }
  else {
    if (*(int *)&(((this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin)->super_TestPlugin).
                 field_0x24 !=
        *(int *)&(((this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin)->super_TestPlugin).
                 field_0x24) {
      pUVar1 = UtestShell::getCurrent();
      (*pUVar1->_vptr_UtestShell[0x1c])
                (pUVar1,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                 ,0x89);
    }
    pUVar1 = UtestShell::getCurrent();
    StringFrom((int)&local_20);
    pcVar2 = SimpleString::asCharString(&local_20);
    StringFrom((int)local_40);
    pcVar3 = SimpleString::asCharString(local_40);
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar1->_vptr_UtestShell[0x16])
              (pUVar1,1,pcVar2,pcVar3,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x89,pTVar4);
    SimpleString::~SimpleString(local_40);
    SimpleString::~SimpleString(&local_20);
  }
  if (((this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin)->postAction == 2) {
    pUVar1 = UtestShell::getCurrent();
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar1->_vptr_UtestShell[0xe])
              (pUVar1,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x8a,pTVar4);
  }
  else {
    if (((this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin)->postAction !=
        ((this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin)->postAction) {
      pUVar1 = UtestShell::getCurrent();
      (*pUVar1->_vptr_UtestShell[0x1c])
                (pUVar1,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                 ,0x8a);
    }
    pUVar1 = UtestShell::getCurrent();
    StringFrom((int)&local_50);
    pcVar2 = SimpleString::asCharString(&local_50);
    StringFrom((int)&local_60);
    pcVar3 = SimpleString::asCharString(&local_60);
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar1->_vptr_UtestShell[0x16])
              (pUVar1,1,pcVar2,pcVar3,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x8a,pTVar4);
    SimpleString::~SimpleString(&local_60);
    SimpleString::~SimpleString(&local_50);
  }
  return;
}

Assistant:

TEST(PluginTest, ActionsAllRun)
{
    genFixture->runAllTests();
    genFixture->runAllTests();
    CHECK_EQUAL(2, firstPlugin->preAction);
    CHECK_EQUAL(2, firstPlugin->postAction);
}